

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O3

double Pa_GetStreamCpuLoad(PaStream *stream)

{
  double dVar1;
  
  if (((stream != (PaStream *)0x0) && (initializationCount_ != 0)) && (*stream == 0x18273645)) {
    dVar1 = (double)(**(code **)(*(long *)((long)stream + 0x10) + 0x38))();
    return dVar1;
  }
  return 0.0;
}

Assistant:

double Pa_GetStreamCpuLoad( PaStream* stream )
{
    PaError error = PaUtil_ValidateStreamPointer( stream );
    double result;

    PA_LOGAPI_ENTER_PARAMS( "Pa_GetStreamCpuLoad" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));

    if( error != paNoError )
    {

        result = 0.0;

        PA_LOGAPI(("Pa_GetStreamCpuLoad returned:\n" ));
        PA_LOGAPI(("\tdouble: 0.0 [PaError error: %d ( %s )]\n", error, Pa_GetErrorText( error ) ));

    }
    else
    {
        result = PA_STREAM_INTERFACE(stream)->GetCpuLoad( stream );

        PA_LOGAPI(("Pa_GetStreamCpuLoad returned:\n" ));
        PA_LOGAPI(("\tdouble: %g\n", result ));

    }

    return result;
}